

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O2

bool __thiscall amrex::MultiCutFab::ok(MultiCutFab *this,int global_box_index)

{
  EBCellFlagFab *pEVar1;
  
  pEVar1 = FabArray<amrex::EBCellFlagFab>::fabPtr(this->m_cellflags,global_box_index);
  return *(int *)&(pEVar1->super_BaseFab<amrex::EBCellFlag>).field_0x44 == 1;
}

Assistant:

bool
MultiCutFab::ok (int global_box_index) const noexcept
{
    return (*m_cellflags)[global_box_index].getType() == FabType::singlevalued;
}